

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void * hd_calloc(hd_context *ctx,size_t count,size_t size)

{
  undefined1 auVar1 [16];
  void *p;
  size_t size_local;
  size_t count_local;
  hd_context *ctx_local;
  
  if ((count == 0) || (size == 0)) {
    ctx_local = (hd_context *)0x0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = size;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < count) {
      hd_throw(ctx,1,"calloc (%zu x %zu bytes) failed (size_t overflow)",count,size);
    }
    ctx_local = (hd_context *)do_scavenging_malloc(ctx,count * size);
    if (ctx_local == (hd_context *)0x0) {
      hd_throw(ctx,1,"calloc (%zu x %zu bytes) failed",count,size);
    }
    memset(ctx_local,0,count * size);
  }
  return ctx_local;
}

Assistant:

void *
hd_calloc(hd_context *ctx, size_t count, size_t size)
{
    void *p;

    if (count == 0 || size == 0)
        return 0;

    if (count > SIZE_MAX / size)
    {
        hd_throw(ctx, HD_ERROR_MEMORY, "calloc (" FMT_zu " x " FMT_zu " bytes) failed (size_t overflow)", count, size);
    }

    p = do_scavenging_malloc(ctx, count * size);
    if (!p)
    {
        hd_throw(ctx, HD_ERROR_MEMORY, "calloc (" FMT_zu " x " FMT_zu " bytes) failed", count, size);
    }
    memset(p, 0, count*size);
    return p;
}